

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlParserNsPush(xmlParserCtxtPtr ctxt,xmlHashedString *prefix,xmlHashedString *uri,void *saxData
                   ,int defAttr)

{
  xmlParserNsBucket *pxVar1;
  uint uVar2;
  xmlChar **ppxVar3;
  xmlParserNsExtra *pxVar4;
  xmlParserNsBucket *__s;
  xmlParserNsData *pxVar5;
  uint uVar6;
  ulong uVar7;
  xmlChar *str2;
  uint uVar8;
  ulong uVar9;
  char *msg;
  xmlParserNsBucket *bucket;
  void *local_50;
  uint local_44;
  xmlHashedString *local_40;
  size_t local_38;
  
  bucket = (xmlParserNsBucket *)0x0;
  if ((prefix != (xmlHashedString *)0x0) && (prefix->name == ctxt->str_xml)) {
    return 0;
  }
  uVar2 = ctxt->nsMax;
  if ((int)uVar2 <= ctxt->nsNr) {
    local_50 = saxData;
    if ((int)uVar2 < 1) {
      uVar9 = 0x10;
LAB_0013d15f:
      ppxVar3 = (xmlChar **)(*xmlRealloc)(ctxt->nsTab,(ulong)(uint)((int)uVar9 * 2) << 3);
      if (ppxVar3 != (xmlChar **)0x0) {
        ctxt->nsTab = ppxVar3;
        pxVar4 = (xmlParserNsExtra *)(*xmlRealloc)(ctxt->nsdb->extra,uVar9 * 0x18);
        if (pxVar4 != (xmlParserNsExtra *)0x0) {
          ctxt->nsdb->extra = pxVar4;
          ctxt->nsMax = (int)uVar9;
          saxData = local_50;
          goto LAB_0013d1c4;
        }
      }
    }
    else if (uVar2 < 1000000000) {
      uVar8 = uVar2 + 1 >> 1;
      uVar6 = uVar8 + uVar2;
      if (1000000000 - uVar8 < uVar2) {
        uVar6 = 1000000000;
      }
      uVar9 = (ulong)uVar6;
      goto LAB_0013d15f;
    }
    xmlCtxtErrMemory(ctxt);
    goto LAB_0013d349;
  }
LAB_0013d1c4:
  local_40 = uri;
  if ((prefix == (xmlHashedString *)0x0) || (str2 = prefix->name, str2 == (xmlChar *)0x0)) {
    pxVar5 = ctxt->nsdb;
    uVar2 = pxVar5->defaultNsIndex;
    if ((ulong)uVar2 != 0x7fffffff) {
      if (pxVar5->extra[uVar2].elementId == pxVar5->elementId) {
        if (defAttr != 0) {
          return 0;
        }
        msg = "Attribute %s redefined\n";
        str2 = (xmlChar *)0x0;
        goto LAB_0013d418;
      }
      if (((ctxt->options & 0x2000) != 0) && (uri->name == ctxt->nsTab[(ulong)(uVar2 * 2) + 1])) {
        return 0;
      }
    }
    uVar6 = ctxt->nsNr;
    pxVar5->defaultNsIndex = uVar6;
  }
  else {
    uVar2 = xmlParserNsLookup(ctxt,prefix,&bucket);
    if (uVar2 != 0x7fffffff) {
      if (ctxt->nsdb->extra[uVar2].elementId == ctxt->nsdb->elementId) {
        if (defAttr != 0) {
          return 0;
        }
        msg = "Attribute %s:%s redefined\n";
LAB_0013d418:
        xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ATTRIBUTE_REDEFINED,XML_ERR_FATAL,
                   "xmlns",str2,(xmlChar *)0x0,0,msg,"xmlns");
        return 0;
      }
      if ((ctxt->options & 0x2000) == 0) {
        ppxVar3 = ctxt->nsTab;
      }
      else {
        ppxVar3 = ctxt->nsTab;
        if (uri->name == ppxVar3[(long)bucket->index * 2 + 1]) {
          return 0;
        }
      }
      uVar6 = ctxt->nsNr;
      bucket->index = uVar6;
      ppxVar3 = ppxVar3 + uVar6 * 2;
      goto LAB_0013d4c6;
    }
    uVar2 = prefix->hashValue;
    pxVar5 = ctxt->nsdb;
    uVar6 = pxVar5->hashSize;
    uVar8 = pxVar5->hashElems + 1;
    if (uVar6 >> 1 < uVar8) {
      if ((int)uVar6 < 0) {
LAB_0013d349:
        xmlCtxtErrMemory(ctxt);
        return -1;
      }
      uVar9 = 0x10;
      if (uVar6 != 0) {
        uVar9 = (ulong)(uVar6 * 2);
      }
      local_38 = uVar9 * 8;
      local_44 = uVar2;
      __s = (xmlParserNsBucket *)(*xmlMalloc)(local_38);
      if (__s == (xmlParserNsBucket *)0x0) goto LAB_0013d349;
      local_50 = saxData;
      memset(__s,0,local_38);
      pxVar5 = ctxt->nsdb;
      uVar2 = (uint)uVar9;
      if (pxVar5->hashSize != 0) {
        uVar9 = 0;
        do {
          pxVar1 = pxVar5->hash;
          if ((pxVar1[uVar9].hashValue != 0) && (pxVar1[uVar9].index != 0x7fffffff)) {
            uVar7 = (ulong)(pxVar1[uVar9].hashValue & uVar2 - 1);
            while (__s[uVar7].hashValue != 0) {
              uVar6 = (int)uVar7 + 1;
              uVar7 = (ulong)uVar6;
              if (uVar6 == uVar2) {
                uVar7 = 0;
              }
            }
            __s[uVar7] = pxVar1[uVar9];
            pxVar5 = ctxt->nsdb;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < pxVar5->hashSize);
      }
      (*xmlFree)(pxVar5->hash);
      pxVar5 = ctxt->nsdb;
      pxVar5->hash = __s;
      pxVar5->hashSize = uVar2;
      uVar9 = (ulong)(uVar2 - 1 & local_44);
      uVar6 = __s[uVar9].hashValue;
      while (uVar6 != 0) {
        uVar6 = (int)uVar9 + 1;
        if (uVar6 == uVar2) {
          uVar6 = 0;
        }
        uVar9 = (ulong)uVar6;
        uVar6 = __s[uVar9].hashValue;
      }
      bucket = __s + uVar9;
      uVar8 = pxVar5->hashElems + 1;
      saxData = local_50;
      uVar2 = local_44;
    }
    bucket->hashValue = uVar2;
    uVar6 = ctxt->nsNr;
    bucket->index = uVar6;
    pxVar5->hashElems = uVar8;
    uVar2 = 0x7fffffff;
  }
  ppxVar3 = ctxt->nsTab + uVar6 * 2;
  if (prefix == (xmlHashedString *)0x0) {
    str2 = (xmlChar *)0x0;
  }
  else {
    str2 = prefix->name;
  }
LAB_0013d4c6:
  *ppxVar3 = str2;
  ppxVar3[1] = local_40->name;
  pxVar5 = ctxt->nsdb;
  pxVar4 = pxVar5->extra + uVar6;
  pxVar4->saxData = saxData;
  if (prefix == (xmlHashedString *)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = prefix->hashValue;
  }
  pxVar4->prefixHashValue = uVar8;
  pxVar4->uriHashValue = local_40->hashValue;
  pxVar4->elementId = pxVar5->elementId;
  pxVar4->oldIndex = uVar2;
  ctxt->nsNr = uVar6 + 1;
  return 1;
}

Assistant:

static int
xmlParserNsPush(xmlParserCtxtPtr ctxt, const xmlHashedString *prefix,
                const xmlHashedString *uri, void *saxData, int defAttr) {
    xmlParserNsBucket *bucket = NULL;
    xmlParserNsExtra *extra;
    const xmlChar **ns;
    unsigned hashValue, nsIndex, oldIndex;

    if ((prefix != NULL) && (prefix->name == ctxt->str_xml))
        return(0);

    if ((ctxt->nsNr >= ctxt->nsMax) && (xmlParserNsGrow(ctxt) < 0)) {
        xmlErrMemory(ctxt);
        return(-1);
    }

    /*
     * Default namespace and 'xml' namespace
     */
    if ((prefix == NULL) || (prefix->name == NULL)) {
        oldIndex = ctxt->nsdb->defaultNsIndex;

        if (oldIndex != INT_MAX) {
            extra = &ctxt->nsdb->extra[oldIndex];

            if (extra->elementId == ctxt->nsdb->elementId) {
                if (defAttr == 0)
                    xmlErrAttributeDup(ctxt, NULL, BAD_CAST "xmlns");
                return(0);
            }

            if ((ctxt->options & XML_PARSE_NSCLEAN) &&
                (uri->name == ctxt->nsTab[oldIndex * 2 + 1]))
                return(0);
        }

        ctxt->nsdb->defaultNsIndex = ctxt->nsNr;
        goto populate_entry;
    }

    /*
     * Hash table lookup
     */
    oldIndex = xmlParserNsLookup(ctxt, prefix, &bucket);
    if (oldIndex != INT_MAX) {
        extra = &ctxt->nsdb->extra[oldIndex];

        /*
         * Check for duplicate definitions on the same element.
         */
        if (extra->elementId == ctxt->nsdb->elementId) {
            if (defAttr == 0)
                xmlErrAttributeDup(ctxt, BAD_CAST "xmlns", prefix->name);
            return(0);
        }

        if ((ctxt->options & XML_PARSE_NSCLEAN) &&
            (uri->name == ctxt->nsTab[bucket->index * 2 + 1]))
            return(0);

        bucket->index = ctxt->nsNr;
        goto populate_entry;
    }

    /*
     * Insert new bucket
     */

    hashValue = prefix->hashValue;

    /*
     * Grow hash table, 50% fill factor
     */
    if (ctxt->nsdb->hashElems + 1 > ctxt->nsdb->hashSize / 2) {
        xmlParserNsBucket *newHash;
        unsigned newSize, i, index;

        if (ctxt->nsdb->hashSize > UINT_MAX / 2) {
            xmlErrMemory(ctxt);
            return(-1);
        }
        newSize = ctxt->nsdb->hashSize ? ctxt->nsdb->hashSize * 2 : 16;
        newHash = xmlMalloc(newSize * sizeof(newHash[0]));
        if (newHash == NULL) {
            xmlErrMemory(ctxt);
            return(-1);
        }
        memset(newHash, 0, newSize * sizeof(newHash[0]));

        for (i = 0; i < ctxt->nsdb->hashSize; i++) {
            unsigned hv = ctxt->nsdb->hash[i].hashValue;
            unsigned newIndex;

            if ((hv == 0) || (ctxt->nsdb->hash[i].index == INT_MAX))
                continue;
            newIndex = hv & (newSize - 1);

            while (newHash[newIndex].hashValue != 0) {
                newIndex++;
                if (newIndex == newSize)
                    newIndex = 0;
            }

            newHash[newIndex] = ctxt->nsdb->hash[i];
        }

        xmlFree(ctxt->nsdb->hash);
        ctxt->nsdb->hash = newHash;
        ctxt->nsdb->hashSize = newSize;

        /*
         * Relookup
         */
        index = hashValue & (newSize - 1);

        while (newHash[index].hashValue != 0) {
            index++;
            if (index == newSize)
                index = 0;
        }

        bucket = &newHash[index];
    }

    bucket->hashValue = hashValue;
    bucket->index = ctxt->nsNr;
    ctxt->nsdb->hashElems++;
    oldIndex = INT_MAX;

populate_entry:
    nsIndex = ctxt->nsNr;

    ns = &ctxt->nsTab[nsIndex * 2];
    ns[0] = prefix ? prefix->name : NULL;
    ns[1] = uri->name;

    extra = &ctxt->nsdb->extra[nsIndex];
    extra->saxData = saxData;
    extra->prefixHashValue = prefix ? prefix->hashValue : 0;
    extra->uriHashValue = uri->hashValue;
    extra->elementId = ctxt->nsdb->elementId;
    extra->oldIndex = oldIndex;

    ctxt->nsNr++;

    return(1);
}